

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O1

bool __thiscall QSqlTableModel::deleteRowFromTable(QSqlTableModel *this,int row)

{
  QSqlDatabase *this_00;
  QSqlTableModelPrivate *this_01;
  QExplicitlySharedDataPointer<QSqlErrorPrivate> QVar1;
  bool bVar2;
  QSqlDriver *pQVar3;
  QString *pQVar4;
  long *plVar5;
  long in_FS_OFFSET;
  QLatin1String QVar6;
  QByteArrayView QVar7;
  QSqlRecord whereValues;
  QString local_d8;
  QString local_b8;
  QSqlError local_a0;
  QArrayData *local_98;
  undefined8 uStack_90;
  long local_88;
  QExplicitlySharedDataPointer<QSqlRecordPrivate> local_78;
  char16_t *pcStack_70;
  long local_68;
  undefined1 local_60 [8];
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QSqlTableModelPrivate **)&(this->super_QSqlQueryModel).field_0x8;
  local_58.d.ptr = (char16_t *)&local_78;
  local_78.d.ptr._0_4_ = row;
  local_58.d.d = (Data *)0x0;
  QMetaObject::activate((QObject *)this,&staticMetaObject,3,(void **)&local_58);
  local_60 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
  primaryValues((QSqlTableModel *)local_60,(int)this);
  this_00 = &this_01->db;
  pQVar3 = QSqlDatabase::driver(this_00);
  bVar2 = (bool)(**(code **)(*(long *)pQVar3 + 0xb8))(pQVar3,4);
  local_68 = -0x5555555555555556;
  local_78.d.ptr =
       (totally_ordered_wrapper<QSqlRecordPrivate_*>)(QSqlRecordPrivate *)0xaaaaaaaaaaaaaaaa;
  pcStack_70 = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pQVar3 = QSqlDatabase::driver(this_00);
  QSqlRecord::QSqlRecord((QSqlRecord *)&local_58);
  (**(code **)(*(long *)pQVar3 + 0xa8))(&local_78,pQVar3,4,&this_01->tableName,&local_58,bVar2);
  QSqlRecord::~QSqlRecord((QSqlRecord *)&local_58);
  local_88 = -0x5555555555555556;
  local_98 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
  uStack_90 = 0xaaaaaaaaaaaaaaaa;
  pQVar3 = QSqlDatabase::driver(this_00);
  (**(code **)(*(long *)pQVar3 + 0xa8))(&local_98,pQVar3,0,&this_01->tableName,local_60,bVar2);
  if ((local_68 == 0) || (local_88 == 0)) {
    QVar7.m_data = (storage_type *)0x14;
    QVar7.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar7);
    local_b8.d.d = local_58.d.d;
    local_b8.d.ptr = local_58.d.ptr;
    local_b8.d.size = local_58.d.size;
    local_58.d.size = 0;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_d8.d.size = 0;
    local_d8.d.d = (Data *)0x0;
    local_d8.d.ptr = (char16_t *)0x0;
    QSqlError::QSqlError(&local_a0,&local_b8,&local_58,StatementError,&local_d8);
    QVar1.d.ptr = (totally_ordered_wrapper<QSqlErrorPrivate_*>)
                  (this_01->super_QSqlQueryModelPrivate).error.d.d.ptr;
    (this_01->super_QSqlQueryModelPrivate).error.d.d.ptr = (QSqlErrorPrivate *)local_a0.d.d.ptr;
    local_a0.d.d.ptr =
         (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
         (QExplicitlySharedDataPointer<QSqlErrorPrivate>)QVar1.d.ptr;
    QSqlError::~QSqlError(&local_a0);
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QSqlRecordPrivate *)local_58.d.d != (QSqlRecordPrivate *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    bVar2 = false;
  }
  else {
    local_58.d.d = (Data *)local_78.d.ptr;
    local_58.d.ptr = pcStack_70;
    local_58.d.size = local_68;
    if (local_78.d.ptr != (QSqlRecordPrivate *)0x0) {
      LOCK();
      *(int *)local_78.d.ptr = *(int *)local_78.d.ptr + 1;
      UNLOCK();
    }
    QVar6.m_data = (char *)0x1;
    QVar6.m_size = (qsizetype)&local_58;
    pQVar4 = (QString *)QString::append(QVar6);
    plVar5 = (long *)QString::append(pQVar4);
    local_b8.d.d = (Data *)*plVar5;
    local_b8.d.ptr = (char16_t *)plVar5[1];
    local_b8.d.size = plVar5[2];
    if ((QArrayData *)local_b8.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_b8.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_b8.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QSqlRecordPrivate *)local_58.d.d != (QSqlRecordPrivate *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    QSqlRecord::QSqlRecord((QSqlRecord *)&local_58);
    bVar2 = QSqlTableModelPrivate::exec
                      (this_01,&local_b8,bVar2,(QSqlRecord *)&local_58,(QSqlRecord *)local_60);
    QSqlRecord::~QSqlRecord((QSqlRecord *)&local_58);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (local_98 != (QArrayData *)0x0) {
    LOCK();
    (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98,2,0x10);
    }
  }
  if (local_78.d.ptr != (QSqlRecordPrivate *)0x0) {
    LOCK();
    *(int *)local_78.d.ptr = *(int *)local_78.d.ptr + -1;
    UNLOCK();
    if (*(int *)local_78.d.ptr == 0) {
      QArrayData::deallocate((QArrayData *)local_78.d.ptr,2,0x10);
    }
  }
  QSqlRecord::~QSqlRecord((QSqlRecord *)local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlTableModel::deleteRowFromTable(int row)
{
    Q_D(QSqlTableModel);
    emit beforeDelete(row);

    const QSqlRecord whereValues = primaryValues(row);
    const bool prepStatement = d->db.driver()->hasFeature(QSqlDriver::PreparedQueries);
    const QString stmt = d->db.driver()->sqlStatement(QSqlDriver::DeleteStatement,
                                                      d->tableName,
                                                      QSqlRecord(),
                                                      prepStatement);
    const QString where = d->db.driver()->sqlStatement(QSqlDriver::WhereStatement,
                                                       d->tableName,
                                                       whereValues,
                                                       prepStatement);

    if (stmt.isEmpty() || where.isEmpty()) {
        d->error = QSqlError("Unable to delete row"_L1, QString(), QSqlError::StatementError);
        return false;
    }

    return d->exec(SqlTm::concat(stmt, where), prepStatement, QSqlRecord() /* no new values */, whereValues);
}